

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apu.cpp
# Opt level: O2

uint32_t __thiscall trackerboy::apu::Timer::fastforward(Timer *this,uint32_t cycles)

{
  uint uVar1;
  uint uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  
  uVar1 = this->mCounter;
  uVar4 = uVar1 - cycles;
  if (uVar1 < cycles || uVar4 == 0) {
    uVar2 = this->mPeriod;
    uVar3 = (cycles - uVar1) / uVar2 + 1;
    uVar4 = uVar2 - (cycles - uVar1) % uVar2;
  }
  else {
    uVar3 = 0;
  }
  this->mCounter = uVar4;
  return uVar3;
}

Assistant:

uint32_t Timer::fastforward(uint32_t cycles) noexcept {
    if (cycles < mCounter) {
        mCounter -= cycles;
        return 0;
    } else {
        cycles -= mCounter;
        auto clocks = (cycles / mPeriod) + 1;
        mCounter = mPeriod - (cycles % mPeriod);
        return clocks;
    }
}